

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::addShapeConversion(TIntermediate *this,TType *type,TIntermTyped *node)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  TOperator op;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermediate *pTVar5;
  TPoolAllocator *this_00;
  TIntermAggregate *pTVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermediate *this_01;
  TIntermTyped *local_38;
  undefined4 extraout_var_02;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  bVar1 = TType::operator==((TType *)CONCAT44(extraout_var,iVar3),type);
  if (bVar1) {
    return node;
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x128))
                    ((long *)CONCAT44(extraout_var_00,iVar3));
  if (cVar2 != '\0') {
    return node;
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xe8))
                    ((long *)CONCAT44(extraout_var_01,iVar3));
  if (cVar2 != '\0') {
    return node;
  }
  iVar3 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar3 != '\0') {
    return node;
  }
  pTVar5 = (TIntermediate *)type;
  iVar3 = (*type->_vptr_TType[0x1d])();
  if ((char)iVar3 != '\0') {
    return node;
  }
  op = mapTypeToConstructorOp(pTVar5,type);
  if (this->source == EShSourceHlsl) {
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    pTVar5 = (TIntermediate *)CONCAT44(extraout_var_02,iVar3);
    cVar2 = (**(code **)(*(long *)pTVar5 + 200))(pTVar5);
    if ((cVar2 != '\0') && (iVar3 = (*type->_vptr_TType[0x1c])(type), (char)iVar3 != '\0')) {
      iVar3 = TType::computeNumComponents(type);
      this_00 = GetThreadPoolAllocator();
      pTVar6 = (TIntermAggregate *)TPoolAllocator::allocate(this_00,0x188);
      TIntermAggregate::TIntermAggregate(pTVar6);
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])(node);
      if ((CONCAT44(extraout_var_03,iVar4) == 0) &&
         (iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node),
         CONCAT44(extraout_var_04,iVar4) == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                      ,0x49f,
                      "TIntermTyped *glslang::TIntermediate::addShapeConversion(const TType &, TIntermTyped *)"
                     );
      }
      if (0 < iVar3) {
        do {
          iVar4 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(pTVar6);
          local_38 = node;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_05,iVar4),(TIntermNode **)&local_38);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      pTVar7 = setAggregateOperator
                         (this,(TIntermNode *)pTVar6,op,type,
                          (TSourceLoc *)CONCAT44(extraout_var_06,iVar3));
      return pTVar7;
    }
    cVar2 = (**(code **)(*(long *)pTVar5 + 0xc0))(pTVar5);
    if (((cVar2 != '\0') &&
        (this_01 = (TIntermediate *)type, iVar3 = (*type->_vptr_TType[0x18])(), (char)iVar3 == '\0')
        ) || ((cVar2 = (**(code **)(*(long *)pTVar5 + 0xc0))(pTVar5), cVar2 == '\0' &&
              (this_01 = (TIntermediate *)type, iVar3 = (*type->_vptr_TType[0x18])(),
              (char)iVar3 != '\0')))) goto LAB_0040ebc3;
    cVar2 = (**(code **)(*(long *)pTVar5 + 0xe0))(pTVar5);
    if (cVar2 != '\0') {
      iVar3 = (*type->_vptr_TType[0x1c])(type);
      if ((char)iVar3 == '\0') {
        iVar3 = (*type->_vptr_TType[0x1b])(type);
        if (((((char)iVar3 != '\0') && (iVar3 = (*type->_vptr_TType[0xc])(type), iVar3 == 4)) &&
            (iVar3 = (**(code **)(*(long *)pTVar5 + 0x68))(pTVar5), iVar3 == 2)) &&
           (this_01 = pTVar5, iVar3 = (**(code **)(*(long *)pTVar5 + 0x70))(), iVar3 == 2))
        goto LAB_0040ebc3;
      }
      else {
        iVar3 = (**(code **)(*(long *)pTVar5 + 0x68))(pTVar5);
        iVar4 = (*type->_vptr_TType[0xd])(type);
        if (iVar3 == iVar4) {
          iVar3 = (**(code **)(*(long *)pTVar5 + 0x70))(pTVar5);
          iVar4 = (*type->_vptr_TType[0xe])(type);
          if (iVar3 == iVar4) goto LAB_0040eaa6;
        }
        iVar3 = (**(code **)(*(long *)pTVar5 + 0x68))(pTVar5);
        iVar4 = (*type->_vptr_TType[0xd])(type);
        if (iVar4 <= iVar3) {
          iVar3 = (**(code **)(*(long *)pTVar5 + 0x70))(pTVar5);
          this_01 = (TIntermediate *)type;
          iVar4 = (*type->_vptr_TType[0xe])();
          if (iVar4 <= iVar3) goto LAB_0040ebc3;
        }
      }
    }
LAB_0040eaa6:
    cVar2 = (**(code **)(*(long *)pTVar5 + 0xd8))(pTVar5);
    if (cVar2 != '\0') {
      iVar3 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar3 == '\0') {
        iVar3 = (*type->_vptr_TType[0x1c])(type);
        if ((((char)iVar3 != '\0') &&
            (iVar3 = (**(code **)(*(long *)pTVar5 + 0x60))(pTVar5), iVar3 == 4)) &&
           ((iVar3 = (*type->_vptr_TType[0xd])(type), iVar3 == 2 &&
            (this_01 = (TIntermediate *)type, iVar3 = (*type->_vptr_TType[0xe])(), iVar3 == 2))))
        goto LAB_0040ebc3;
      }
      else {
        iVar3 = (**(code **)(*(long *)pTVar5 + 0x60))(pTVar5);
        this_01 = (TIntermediate *)type;
        iVar4 = (*type->_vptr_TType[0xc])();
        if (iVar4 < iVar3) goto LAB_0040ebc3;
      }
    }
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 200))
                    ((long *)CONCAT44(extraout_var_07,iVar3));
  if ((cVar2 == '\0') ||
     (this_01 = (TIntermediate *)type, iVar3 = (*type->_vptr_TType[0x1b])(), (char)iVar3 == '\0')) {
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0xd8))
                      ((long *)CONCAT44(extraout_var_08,iVar3));
    if ((cVar2 == '\0') ||
       (this_01 = (TIntermediate *)type, iVar3 = (*type->_vptr_TType[0x18])(), (char)iVar3 == '\0'))
    {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2b])(node);
      if (((char)iVar3 != '\0') && (iVar3 = (*type->_vptr_TType[0x1b])(type), (char)iVar3 != '\0'))
      {
        iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
        this_01 = (TIntermediate *)type;
        iVar4 = (*type->_vptr_TType[0xc])();
        if (iVar4 < iVar3) goto LAB_0040ebc3;
      }
      return node;
    }
  }
LAB_0040ebc3:
  pTVar6 = makeAggregate(this_01,&node->super_TIntermNode);
  iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  pTVar7 = setAggregateOperator
                     (this,(TIntermNode *)pTVar6,op,type,
                      (TSourceLoc *)CONCAT44(extraout_var_09,iVar3));
  return pTVar7;
}

Assistant:

TIntermTyped* TIntermediate::addShapeConversion(const TType& type, TIntermTyped* node)
{
    // no conversion needed
    if (node->getType() == type)
        return node;

    // structures and arrays don't change shape, either to or from
    if (node->getType().isStruct() || node->getType().isArray() ||
        type.isStruct() || type.isArray())
        return node;

    // The new node that handles the conversion
    TOperator constructorOp = mapTypeToConstructorOp(type);

    if (getSource() == EShSourceHlsl) {
        // HLSL rules for scalar, vector and matrix conversions:
        // 1) scalar can become anything, initializing every component with its value
        // 2) vector and matrix can become scalar, first element is used (warning: truncation)
        // 3) matrix can become matrix with less rows and/or columns (warning: truncation)
        // 4) vector can become vector with less rows size (warning: truncation)
        // 5a) vector 4 can become 2x2 matrix (special case) (same packing layout, its a reinterpret)
        // 5b) 2x2 matrix can become vector 4 (special case) (same packing layout, its a reinterpret)

        const TType &sourceType = node->getType();

        // rule 1 for scalar to matrix is special
        if (sourceType.isScalarOrVec1() && type.isMatrix()) {

            // HLSL semantics: the scalar (or vec1) is replicated to every component of the matrix.  Left to its
            // own devices, the constructor from a scalar would populate the diagonal.  This forces replication
            // to every matrix element.

            // Note that if the node is complex (e.g, a function call), we don't want to duplicate it here
            // repeatedly, so we copy it to a temp, then use the temp.
            const int matSize = type.computeNumComponents();
            TIntermAggregate* rhsAggregate = new TIntermAggregate();

            const bool isSimple = (node->getAsSymbolNode() != nullptr) || (node->getAsConstantUnion() != nullptr);

            if (!isSimple) {
                assert(0); // TODO: use node replicator service when available.
            }

            for (int x = 0; x < matSize; ++x)
                rhsAggregate->getSequence().push_back(node);

            return setAggregateOperator(rhsAggregate, constructorOp, type, node->getLoc());
        }

        // rule 1 and 2
        if ((sourceType.isScalar() && !type.isScalar()) || (!sourceType.isScalar() && type.isScalar()))
            return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());

        // rule 3 and 5b
        if (sourceType.isMatrix()) {
            // rule 3
            if (type.isMatrix()) {
                if ((sourceType.getMatrixCols() != type.getMatrixCols() || sourceType.getMatrixRows() != type.getMatrixRows()) &&
                    sourceType.getMatrixCols() >= type.getMatrixCols() && sourceType.getMatrixRows() >= type.getMatrixRows())
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            // rule 5b
            } else if (type.isVector()) {
                if (type.getVectorSize() == 4 && sourceType.getMatrixCols() == 2 && sourceType.getMatrixRows() == 2)
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            }
        }

        // rule 4 and 5a
        if (sourceType.isVector()) {
            // rule 4
            if (type.isVector())
            {
                if (sourceType.getVectorSize() > type.getVectorSize())
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            // rule 5a
            } else if (type.isMatrix()) {
                if (sourceType.getVectorSize() == 4 && type.getMatrixCols() == 2 && type.getMatrixRows() == 2)
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            }
        }
    }

    // scalar -> vector or vec1 -> vector or
    // vector -> scalar or
    // bigger vector -> smaller vector
    if ((node->getType().isScalarOrVec1() && type.isVector()) ||
        (node->getType().isVector() && type.isScalar()) ||
        (node->isVector() && type.isVector() && node->getVectorSize() > type.getVectorSize()))
        return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());

    return node;
}